

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double_node.cpp
# Opt level: O2

void __thiscall
DoubleNode::Act(DoubleNode *this,stack<double,_std::deque<double,_std::allocator<double>_>_> *s)

{
  std::deque<double,_std::allocator<double>_>::push_back(&s->c,&this->value_);
  return;
}

Assistant:

void DoubleNode::Act(std::stack<double> &s) const {
  s.push(value_);
}